

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

size_t get_type_size(Type *type)

{
  Type *type_local;
  
  switch(type->specifier) {
  case TS_VOID:
    type_local = (Type *)0x0;
    break;
  case TS_CHAR:
    type_local = (Type *)0x1;
    break;
  case TS_INT:
    type_local = (Type *)0x4;
    break;
  case TS_FLOAT:
    type_local = (Type *)0x4;
    break;
  case TS_DOUBLE:
    type_local = (Type *)0x8;
    break;
  case TS_STRUCT:
    type_local = *(Type **)(*(long *)(type + 1) + 0x10);
    break;
  case TS_ENUM:
    type_local = (Type *)0x4;
    break;
  case TS_UNION:
    type_local = *(Type **)(*(long *)(type + 1) + 0x10);
    break;
  case TS_POINTER:
    type_local = (Type *)0x4;
    break;
  case TS_ARRAY:
    type_local = *(Type **)(type + 1);
    break;
  case TS_FUNC:
    type_local = (Type *)0x0;
    break;
  case TS_BITFIELD:
    type_local = *(Type **)(type + 1);
    break;
  case TS_NONE:
    type_local = (Type *)0x0;
    break;
  case TS_ERROR:
    type_local = (Type *)0x0;
  }
  return (size_t)type_local;
}

Assistant:

size_t get_type_size(struct Type *type)
{
	switch(type->specifier)
	{
		case TS_VOID:
			return 0;
		case TS_CHAR:
			return 1;
		case TS_INT:
			return INT_SIZE;
		case TS_FLOAT:
			return FLOAT_SIZE;
		case TS_DOUBLE:
			return FLOAT_SIZE*2;
		case TS_STRUCT:
			return ((struct Type_Struct_Union*)type)->struct_union->size;
		case TS_ENUM:
			return INT_SIZE;
		case TS_UNION:
			return ((struct Type_Struct_Union*)type)->struct_union->size;
		case TS_POINTER:
			return PTR_SIZE;
		case TS_ARRAY:
			return ((struct Type_Array*)type)->size;
		case TS_FUNC:
			return 0;
		case TS_BITFIELD:
			return ((struct Type_Bit_Field*)type)->number_of_bits;
		case TS_NONE:
			return 0;
		case TS_ERROR:
			return 0;

	}	
}